

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeMapRef.h
# Opt level: O3

void __thiscall
GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_LoadXMLFromString
          (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *this,gcstring *XMLData)

{
  undefined8 uVar1;
  undefined8 uVar2;
  INodeMap *pIVar3;
  int *piVar4;
  ExceptionReporter<GenICam_3_4::RuntimeException> *this_00;
  CNodeMapFactory nodeMapData;
  ExceptionReporter<GenICam_3_4::RuntimeException> EStack_c8;
  
  if (this->_Ptr == (INodeMap *)0x0) {
    uVar1 = (**(code **)(*(long *)XMLData + 0x48))(XMLData);
    uVar2 = (**(code **)(*(long *)XMLData + 0x88))(XMLData);
    GenApi_3_4::CNodeMapFactory::CNodeMapFactory((CNodeMapFactory *)&EStack_c8,0,uVar1,uVar2,0,0);
    pIVar3 = (INodeMap *)
             GenApi_3_4::CNodeMapFactory::CreateNodeMap
                       (&EStack_c8.m_SourceFileName,(bool)((char)this + '\x10'));
    piVar4 = (int *)operator_new(4);
    *piVar4 = 0;
    if (pIVar3 != (INodeMap *)0x0) {
      *piVar4 = 1;
      this->_Ptr = pIVar3;
      this->_pRefCount = piVar4;
    }
    GenApi_3_4::CNodeMapFactory::~CNodeMapFactory((CNodeMapFactory *)&EStack_c8);
    return;
  }
  this_00 = (ExceptionReporter<GenICam_3_4::RuntimeException> *)__cxa_allocate_exception(0x1f0);
  GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::ExceptionReporter
            (&EStack_c8,
             "/workspace/llm4binary/github/license_c_cmakelists/roboception[P]rc_genicam_api/genicam/library/CPP/include/GenApi/NodeMapRef.h"
             ,0x171,"RuntimeException");
  GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::Report
            (this_00,(char *)&EStack_c8,"Node map already created");
  __cxa_throw(this_00,&GenICam_3_4::RuntimeException::typeinfo,
              GenICam_3_4::GenericException::~GenericException);
}

Assistant:

inline void CNodeMapRefT<TCameraParams>::_LoadXMLFromString(const GENICAM_NAMESPACE::gcstring& XMLData)
    {
        // Load the DLL
        if(_Ptr)
            throw RUNTIME_EXCEPTION("Node map already created");

        // Load the XML file
        CNodeMapFactory nodeMapData(ContentType_Xml, XMLData.c_str(), XMLData.size()); //avoid string copy

        // First create node map then the reference counter. This prevents a leak in case of bad node map
        INodeMap* pNodeMap = nodeMapData.CreateNodeMap(_DeviceName);
        Attach( pNodeMap, _DeviceName, new int( 0 ) );
    }